

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_iterator.h
# Opt level: O3

uint32_t cppcms::utf8::next<char_const*>(char **p,char *e,bool html,bool param_4)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  uchar c_2;
  uchar c_1;
  
  pbVar3 = (byte *)*p;
  if (pbVar3 != (byte *)e) {
    pbVar1 = pbVar3 + 1;
    *p = (char *)pbVar1;
    bVar2 = *pbVar3;
    uVar4 = (uint)bVar2;
    if ((char)bVar2 < '\0') {
      if (0xc1 < bVar2) {
        if (bVar2 < 0xe0) {
          if (pbVar1 != (byte *)e) {
            *p = (char *)(pbVar3 + 2);
          }
        }
        else if (bVar2 < 0xf0) {
          if (pbVar1 != (byte *)e) {
            *p = (char *)(pbVar3 + 2);
          }
        }
        else if ((bVar2 < 0xf5) && (pbVar1 != (byte *)e)) {
          *p = (char *)(pbVar3 + 2);
        }
      }
    }
    else {
      if ((!html) || (0x1f < bVar2 && uVar4 != 0x7f)) {
        return uVar4;
      }
      if ((byte)(uVar4 - 9) < 5) {
        return *(uint32_t *)(&DAT_00243108 + (ulong)(uVar4 - 9 & 0xff) * 4);
      }
    }
  }
  return 0xffffffff;
}

Assistant:

uint32_t next(Iterator &p,Iterator e,bool html=false,bool /*decode*/=false)
	{
		using utf::illegal;
		if(p==e)
			return illegal;

		unsigned char lead = *p++;

		// First byte is fully validated here
		int trail_size = trail_length(lead);

		if(trail_size < 0)
			return illegal;

		//
		// Ok as only ASCII may be of size = 0
		// also optimize for ASCII text
		//
		if(trail_size == 0) {
			if(!html || (lead >= 0x20 && lead!=0x7F) || lead==0x9 || lead==0x0A || lead==0x0D)
				return lead;
			return illegal;
		}

		uint32_t c = lead & ((1<<(6-trail_size))-1);

		// Read the rest
		unsigned char tmp;
		switch(trail_size) {
			case 3:
				if(p==e)
					return illegal;
				tmp = *p++;
				if (!is_trail(tmp))
					return illegal;
				c = (c << 6) | ( tmp & 0x3F);
			case 2:
				if(p==e)
					return illegal;
				tmp = *p++;
				if (!is_trail(tmp))
					return illegal;
				c = (c << 6) | ( tmp & 0x3F);
			case 1:
				if(p==e)
					return illegal;
				tmp = *p++;
				if (!is_trail(tmp))
					return illegal;
				c = (c << 6) | ( tmp & 0x3F);
		}

		// Check code point validity: no surrogates and
		// valid range
		if(!utf::valid(c))
			return illegal;

		// make sure it is the most compact representation
		if(width(c)!=trail_size + 1)
			return illegal;
		
		if(html && c<0xA0)
			return illegal;
		return c;
	}